

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToDrawDataSelectLayer(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  (GImGui->IO).MetricsActiveWindows = (GImGui->IO).MetricsActiveWindows + 1;
  if ((window->Flags & 0x2000000U) == 0) {
    AddWindowToDrawData((pIVar1->DrawDataBuilder).Layers,window);
  }
  else {
    AddWindowToDrawData((pIVar1->DrawDataBuilder).Layers + 1,window);
  }
  return;
}

Assistant:

static void AddWindowToDrawDataSelectLayer(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsActiveWindows++;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
        AddWindowToDrawData(&g.DrawDataBuilder.Layers[1], window);
    else
        AddWindowToDrawData(&g.DrawDataBuilder.Layers[0], window);
}